

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadIdentifier(AsciiParser *this,string *token)

{
  int *piVar1;
  ulong uVar2;
  StreamReader *pSVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  string sVar8;
  stringstream ss;
  string local_1d8;
  undefined7 uStack_1d7;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pSVar3 = this->_sr;
  uVar4 = pSVar3->length_;
  uVar6 = pSVar3->idx_ + 1;
  if (uVar6 <= uVar4) {
    sVar8 = *(string *)(pSVar3->binary_ + pSVar3->idx_);
    pSVar3->idx_ = uVar6;
    if ((sVar8 == (string)0x5f) || (iVar5 = isalpha((int)(char)sVar8), iVar5 != 0)) {
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
      local_1d8 = sVar8;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
      do {
        pSVar3 = this->_sr;
        uVar6 = pSVar3->length_;
        uVar4 = pSVar3->idx_;
        if ((uVar6 <= uVar4) || (pSVar3->binary_[uVar4] == '\0')) goto LAB_003a4b11;
        uVar2 = uVar4 + 1;
        if (uVar2 <= uVar6) {
          sVar8 = *(string *)(pSVar3->binary_ + uVar4);
          pSVar3->idx_ = uVar2;
        }
        iVar5 = 1;
        if (uVar2 <= uVar6) {
          if ((sVar8 == (string)0x5f) || (iVar5 = isalnum((int)(char)sVar8), iVar5 != 0)) {
            piVar1 = &(this->_curr_cursor).col;
            *piVar1 = *piVar1 + 1;
            local_1d8 = sVar8;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
            iVar5 = 0;
          }
          else {
            iVar5 = 3;
            if ((0 < (long)pSVar3->idx_) && (uVar6 = pSVar3->idx_ - 1, uVar6 <= pSVar3->length_)) {
              pSVar3->idx_ = uVar6;
            }
          }
        }
      } while (iVar5 == 0);
      if (iVar5 == 3) {
LAB_003a4b11:
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)token,&local_1d8);
        if ((long *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
          operator_delete((long *)CONCAT71(uStack_1d7,local_1d8),local_1c8[0] + 1);
        }
        bVar7 = true;
        goto LAB_003a4b48;
      }
    }
    else {
      uVar6 = pSVar3->idx_ - 1;
      if (uVar6 <= uVar4 && 0 < (long)pSVar3->idx_) {
        pSVar3->idx_ = uVar6;
      }
    }
  }
  bVar7 = false;
LAB_003a4b48:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar7;
}

Assistant:

bool AsciiParser::ReadIdentifier(std::string *token) {
  // identifier = (`_` | [a-zA-Z]) (`_` | [a-zA-Z0-9]+)
  std::stringstream ss;

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      DCOUT("read1 failed.");
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalpha(int(c))) {
      DCOUT(fmt::format("Invalid identiefier: '{}'", c));
      _sr->seek_from_current(-1);
      return false;
    }
    _curr_cursor.col++;

    ss << c;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalnum(int(c))) {
      _sr->seek_from_current(-1);
      break;  // end of identifier(e.g. ' ')
    }

    _curr_cursor.col++;

    ss << c;
  }

  (*token) = ss.str();
  return true;
}